

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_json_schema.cpp
# Opt level: O0

string * flatbuffers::jsons::anon_unknown_1::GenTypeRef<flatbuffers::EnumDef>
                   (string *__return_storage_ptr__,EnumDef *enum_def)

{
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  EnumDef *local_18;
  EnumDef *enum_def_local;
  
  local_18 = enum_def;
  enum_def_local = (EnumDef *)__return_storage_ptr__;
  GenFullName<flatbuffers::EnumDef>(&local_58,enum_def);
  std::operator+(&local_38,"\"$ref\" : \"#/definitions/",&local_58);
  std::operator+(__return_storage_ptr__,&local_38,"\"");
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

static std::string GenTypeRef(const T *enum_def) {
  return "\"$ref\" : \"#/definitions/" + GenFullName(enum_def) + "\"";
}